

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

void __thiscall QPainterPath::lineTo(QPainterPath *this,QPointF *p)

{
  QList<QPainterPath::Element> *this_00;
  QPainterPathPrivate *pQVar1;
  long lVar2;
  Element *pEVar3;
  bool bVar4;
  byte bVar5;
  iterator iVar6;
  long in_FS_OFFSET;
  Element local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = hasValidCoords(*p);
  if (bVar4) {
    if ((this->d_ptr).d.ptr == (QPainterPathPrivate *)0x0) {
      ensureData_helper(this);
    }
    detach(this);
    pQVar1 = (this->d_ptr).d.ptr;
    if ((pQVar1->field_0x84 & 1) != 0) {
      this_00 = &pQVar1->elements;
      iVar6 = QList<QPainterPath::Element>::end(this_00);
      local_38.x = iVar6.i[-1].x;
      local_38.y = iVar6.i[-1].y;
      local_38._16_8_ = *(ulong *)&iVar6.i[-1].type & 0xffffffff00000000;
      QtPrivate::QPodArrayOps<QPainterPath::Element>::emplace<QPainterPath::Element_const&>
                ((QPodArrayOps<QPainterPath::Element> *)this_00,(pQVar1->elements).d.size,&local_38)
      ;
      QList<QPainterPath::Element>::end(this_00);
      pQVar1->field_0x84 = pQVar1->field_0x84 & 0xfe;
    }
    pEVar3 = (pQVar1->elements).d.ptr + (pQVar1->elements).d.size + -1;
    local_38.x = pEVar3->x;
    local_38.y = pEVar3->y;
    bVar4 = qFuzzyCompare(p,(QPointF *)&local_38);
    if (!bVar4) {
      local_38.x = p->xp;
      local_38.y = p->yp;
      local_38._16_8_ = 0xaaaaaaaa00000001;
      QtPrivate::QPodArrayOps<QPainterPath::Element>::emplace<QPainterPath::Element_const&>
                ((QPodArrayOps<QPainterPath::Element> *)&pQVar1->elements,(pQVar1->elements).d.size,
                 &local_38);
      QList<QPainterPath::Element>::end(&pQVar1->elements);
      lVar2 = (pQVar1->elements).d.size;
      if (lVar2 == 3) {
        bVar5 = 0x10;
      }
      else if (lVar2 == 4) {
        pEVar3 = (pQVar1->elements).d.ptr;
        bVar5 = (-(pEVar3[3].y == pEVar3[pQVar1->cStart].y) &
                 -(pEVar3[3].x == pEVar3[pQVar1->cStart].x) & 1U) << 4;
      }
      else {
        bVar5 = 0;
      }
      pQVar1->field_0x84 = pQVar1->field_0x84 & 0xef | bVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::lineTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::lineTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::lineTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());
    d->maybeMoveTo();
    if (p == QPointF(d->elements.constLast()))
        return;
    Element elm = { p.x(), p.y(), LineToElement };
    d->elements.append(elm);

    d->convex = d->elements.size() == 3 || (d->elements.size() == 4 && d->isClosed());
}